

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::Scanner
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,Parser *parser,Token *ptoken,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CharClassifier *pCVar4;
  
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions = doAllowThreeByteSurrogates;
  (this->super_IScanner)._vptr_IScanner = (_func_int **)&PTR_GetErrorLineInfo_015599d8;
  HashTbl::HashTbl(&this->m_htbl,0x100);
  TemporaryBuffer::TemporaryBuffer(&this->m_tempChBuf);
  TemporaryBuffer::TemporaryBuffer(&this->m_tempChBufSecondary);
  (this->m_tokenPrevious).tk = tkLim;
  if (ptoken == (Token *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x4a,"(ptoken)","ptoken");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->m_parser = parser;
  this->m_ptoken = ptoken;
  this->m_scriptContext = scriptContext;
  (this->m_tempChBuf).m_pscanner = this;
  (this->m_tempChBufSecondary).m_pscanner = this;
  pCVar4 = Js::ScriptContext::GetCharClassifier(scriptContext);
  this->charClassifier = pCVar4;
  this->es6UnicodeMode = ((scriptContext->config).threadConfig)->m_ES6Unicode;
  this->m_fHadEol = 0;
  this->m_pchBase = (EncodedCharPtr)0x0;
  this->m_pchLast = (EncodedCharPtr)0x0;
  this->m_pchMinLine = (EncodedCharPtr)0x0;
  this->m_pchMinTok = (EncodedCharPtr)0x0;
  this->m_currentCharacter = (EncodedCharPtr)0x0;
  this->m_pchPrevLine = (EncodedCharPtr)0x0;
  this->m_cMinTokMultiUnits = 0;
  this->m_cMinLineMultiUnits = 0;
  this->m_fStringTemplateDepth = 0;
  this->field_0x508 = this->field_0x508 & 0x10;
  this->m_fYieldIsKeywordRegion = false;
  this->m_fAwaitIsKeywordRegion = false;
  this->m_pchStartLine = (EncodedCharPtr)0x0;
  this->m_line = 0;
  this->m_scanState = ScanStateNormal;
  this->m_ichMinError = 0;
  this->m_ichLimError = 0;
  this->m_startLine = 0;
  this->m_iecpLimTokPrevious = 0xffffffffffffffff;
  this->m_ichLimTokPrevious = 0xffffffff;
  return;
}

Assistant:

Scanner<EncodingPolicy>::Scanner(Parser* parser, Token *ptoken, Js::ScriptContext* scriptContext)
{
    Assert(ptoken);
    m_parser = parser;
    m_ptoken = ptoken;
    m_scriptContext = scriptContext;

    m_tempChBuf.m_pscanner = this;
    m_tempChBufSecondary.m_pscanner = this;

    this->charClassifier = scriptContext->GetCharClassifier();
    this->es6UnicodeMode = scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled();

    ClearStates();
}